

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

bool __thiscall
spvtools::Optimizer::Run
          (Optimizer *this,uint32_t *original_binary,size_t original_binary_size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *optimized_binary,
          ValidatorOptions *validator_options,bool skip_validation)

{
  bool bVar1;
  spv_optimizer_options opt_options_00;
  OptimizerOptions local_40;
  OptimizerOptions opt_options;
  bool skip_validation_local;
  ValidatorOptions *validator_options_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *optimized_binary_local;
  size_t original_binary_size_local;
  uint32_t *original_binary_local;
  Optimizer *this_local;
  
  opt_options.options_._7_1_ = skip_validation;
  OptimizerOptions::OptimizerOptions(&local_40);
  OptimizerOptions::set_run_validator(&local_40,(bool)((opt_options.options_._7_1_ ^ 0xff) & 1));
  OptimizerOptions::set_validator_options(&local_40,validator_options);
  opt_options_00 = OptimizerOptions::operator_cast_to_spv_optimizer_options_t_(&local_40);
  bVar1 = Run(this,original_binary,original_binary_size,optimized_binary,opt_options_00);
  OptimizerOptions::~OptimizerOptions(&local_40);
  return bVar1;
}

Assistant:

bool Optimizer::Run(const uint32_t* original_binary,
                    const size_t original_binary_size,
                    std::vector<uint32_t>* optimized_binary,
                    const ValidatorOptions& validator_options,
                    bool skip_validation) const {
  OptimizerOptions opt_options;
  opt_options.set_run_validator(!skip_validation);
  opt_options.set_validator_options(validator_options);
  return Run(original_binary, original_binary_size, optimized_binary,
             opt_options);
}